

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginPopupContextItem(char *str_id,int mouse_button)

{
  float fVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiContext *g;
  
  if ((GImGui->CurrentWindow->DC).LastItemHoveredAndUsable == true) {
    if (4 < (uint)mouse_button) {
      __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown)/sizeof(*g.IO.MouseDown)))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0xc54,"bool ImGui::IsMouseClicked(int, bool)");
    }
    fVar1 = (GImGui->IO).MouseDownDuration[(uint)mouse_button];
    if ((fVar1 == 0.0) && (!NAN(fVar1))) {
      OpenPopupEx(str_id,false);
    }
  }
  if ((GImGui->CurrentPopupStack).Size < (GImGui->OpenPopupStack).Size) {
    bVar3 = BeginPopupEx(str_id,0x80);
    return bVar3;
  }
  pIVar2 = GImGui;
  pIVar2->SetNextWindowSizeConstraint = false;
  pIVar2->SetNextWindowFocus = false;
  pIVar2->SetNextWindowPosCond = 0;
  pIVar2->SetNextWindowSizeCond = 0;
  pIVar2->SetNextWindowContentSizeCond = 0;
  pIVar2->SetNextWindowCollapsedCond = 0;
  return false;
}

Assistant:

bool ImGui::BeginPopupContextItem(const char* str_id, int mouse_button)
{
    if (IsItemHovered() && IsMouseClicked(mouse_button))
        OpenPopupEx(str_id, false);
    return BeginPopup(str_id);
}